

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void __thiscall DataRefs::SetAircraftDisplayed(DataRefs *this,int bEnable)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  
  if (in_ESI == 0) {
    LTMainHideAircraft();
    *(undefined4 *)(in_RDI + 0x638) = 0;
  }
  else {
    bVar1 = LTMainShowAircraft();
    *(uint *)(in_RDI + 0x638) = (uint)bVar1;
  }
  MenuUpdateAllItemStatus();
  return;
}

Assistant:

void DataRefs::SetAircraftDisplayed ( int bEnable )
{
    // Do what we are asked to do
    if ( bEnable )
    {
        bShowingAircraft = LTMainShowAircraft();
    }
    else
    {
        LTMainHideAircraft();
        bShowingAircraft = 0;
    }
    
    // update menu item's checkmark
    MenuUpdateAllItemStatus();
}